

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_cvars.h
# Opt level: O1

void cvarfunc_vid_maxfps(FIntCVar *self)

{
  int iVar1;
  int iVar2;
  UCVarValue value;
  itimerspec iStack_28;
  
  iVar2 = vid_maxfps.Value;
  if (vid_maxfps.Value == 0 || 0x22 < vid_maxfps.Value) {
    if (vid_maxfps.Value < 0x3e9) {
      if (cl_capfps.Value) {
        return;
      }
      if (I_SetFPSLimit(int)::EventSetup == '\0') {
        I_SetFPSLimit(int)::EventSetup = '\x01';
        I_SetFPSLimit::FPSLimitEvent.sigev_signo = 0;
        I_SetFPSLimit::FPSLimitEvent.sigev_notify = 2;
        I_SetFPSLimit::FPSLimitEvent.sigev_value.sival_int = 0;
        I_SetFPSLimit::FPSLimitEvent._sigev_un._sigev_thread._function = FPSLimitNotify;
        I_SetFPSLimit::FPSLimitEvent._sigev_un._sigev_thread._attribute = (pthread_attr_t *)0x0;
        sem_init((sem_t *)&FPSLimitSemaphore,0,0);
      }
      if (iVar2 < 0) {
        iVar2 = vid_maxfps.Value;
      }
      if (I_SetFPSLimit(int)::FPSLimitTimerEnabled == '\x01') {
        timer_delete(I_SetFPSLimit::FPSLimitTimer);
        I_SetFPSLimit(int)::FPSLimitTimerEnabled = '\0';
      }
      if (iVar2 != 0) {
        I_SetFPSLimit(int)::FPSLimitTimerEnabled = 1;
        iVar1 = timer_create(0,(sigevent *)&I_SetFPSLimit::FPSLimitEvent,
                             &I_SetFPSLimit::FPSLimitTimer);
        if (iVar1 == -1) {
          Printf(2,"Failed to create FPS limitter event\n");
        }
        iStack_28.it_interval.tv_sec = 0;
        iStack_28.it_value.tv_sec = 0;
        iStack_28.it_interval.tv_nsec = (long)(int)(1000000000 / (long)iVar2);
        iStack_28.it_value.tv_nsec = iStack_28.it_interval.tv_nsec;
        iVar2 = timer_settime(I_SetFPSLimit::FPSLimitTimer,0,&iStack_28,(itimerspec *)0x0);
        if (iVar2 == -1) {
          Printf(2,"Failed to set FPS limitter timer\n");
        }
        DPrintf(3,"FPS timer set to %u ms\n",(iStack_28.it_interval.tv_nsec & 0xffffffffU) / 1000000
               );
        return;
      }
      DPrintf(3,"FPS timer disabled\n");
      return;
    }
    value = (UCVarValue)0x3e8;
  }
  else {
    value = (UCVarValue)0x23;
  }
  FBaseCVar::SetGenericRep(&vid_maxfps.super_FBaseCVar,value,CVAR_Int);
  return;
}

Assistant:

inline operator int () const { return Value; }